

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O3

void snapshot_after_block_reuse_test(void)

{
  undefined1 auVar1 [16];
  fdb_status s;
  fdb_status fVar2;
  sb_decision_t sVar3;
  int iVar4;
  fdb_status extraout_EAX;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  fdb_kvs_handle *pfVar9;
  fdb_kvs_handle *pfVar10;
  fdb_kvs_handle *pfVar11;
  char *pcVar12;
  fdb_config *pfVar13;
  fdb_config *pfVar14;
  char *pcVar15;
  fdb_doc **doc;
  uint uVar16;
  uint uVar17;
  size_t unaff_RBP;
  ulong uVar18;
  size_t sVar19;
  fdb_kvs_handle *pfVar20;
  uint uVar21;
  fdb_kvs_handle *unaff_R12;
  ulong unaff_R13;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle;
  char *unaff_R14;
  char *pcVar22;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar23;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar24;
  char *unaff_R15;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  fdb_kvs_config kvs_config;
  char keybuf [16];
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  fdb_kvs_handle *pfStackY_24e0;
  fdb_file_handle *pfStackY_24d8;
  fdb_kvs_config fStackY_24d0;
  char acStackY_24b8 [264];
  fdb_config fStackY_23b0;
  char acStackY_22b8 [520];
  fdb_doc **ppfStackY_20b0;
  size_t sStackY_20a0;
  char *pcStackY_2098;
  char *pcStackY_2090;
  code *pcStackY_2088;
  fdb_kvs_handle *pfStack_2078;
  fdb_file_handle *pfStack_2070;
  fdb_iterator *pfStack_2068;
  fdb_doc *pfStack_2060;
  fdb_kvs_handle *pfStack_2058;
  timeval tStack_2050;
  char acStack_2040 [512];
  fdb_kvs_config fStack_1e40;
  fdb_file_info fStack_1e28;
  char acStack_1de0 [256];
  fdb_config fStack_1ce0;
  char *pcStack_1be8;
  fdb_kvs_handle *pfStack_1be0;
  fdb_kvs_handle *pfStack_1bd8;
  fdb_kvs_handle *pfStack_1bd0;
  fdb_kvs_handle *pfStack_1bc8;
  fdb_kvs_handle *pfStack_1bc0;
  fdb_kvs_handle *pfStack_1bb0;
  fdb_file_handle *pfStack_1ba8;
  uint uStack_1b9c;
  fdb_kvs_info fStack_1b98;
  timeval tStack_1b68;
  fdb_kvs_config fStack_1b58;
  undefined1 auStack_1b40 [80];
  docio_handle *pdStack_1af0;
  btreeblk_handle *pbStack_1ae8;
  btree_blk_ops *pbStack_1ae0;
  filemgr_ops *pfStack_1ad8;
  fdb_config fStack_1ad0;
  undefined1 uStack_18f9;
  fdb_kvs_handle fStack_18f8;
  fdb_kvs_handle *pfStack_16f0;
  char *pcStack_16e8;
  char *pcStack_16e0;
  fdb_kvs_handle *pfStack_16d8;
  fdb_kvs_handle *pfStack_16d0;
  fdb_file_handle *pfStack_16c8;
  timeval tStack_16c0;
  undefined1 auStack_16b0 [536];
  undefined1 auStack_1498 [375];
  undefined1 uStack_1321;
  fdb_kvs_handle *pfStack_1298;
  undefined8 uStack_1280;
  fdb_kvs_handle *pfStack_1258;
  fdb_kvs_handle *pfStack_1250;
  fdb_kvs_handle *pfStack_1248;
  fdb_kvs_handle *pfStack_1240;
  fdb_kvs_handle *pfStack_1238;
  code *pcStack_1230;
  fdb_kvs_handle *pfStack_1228;
  fdb_file_handle *pfStack_1220;
  fdb_kvs_handle *pfStack_1218;
  fdb_kvs_handle *pfStack_1210;
  fdb_kvs_config fStack_1208;
  timeval tStack_11f0;
  fdb_file_info fStack_11e0;
  fdb_kvs_info fStack_1198;
  undefined1 auStack_1168 [512];
  fdb_kvs_handle fStack_f68;
  size_t sStack_d60;
  char *pcStack_d58;
  char *pcStack_d50;
  code *pcStack_d48;
  fdb_kvs_handle *pfStack_d40;
  fdb_file_handle *pfStack_d38;
  fdb_kvs_info fStack_d30;
  timeval tStack_d00;
  fdb_kvs_config fStack_cf0;
  fdb_file_info fStack_cd8;
  char acStack_c90 [256];
  char acStack_b90 [511];
  undefined1 uStack_991;
  fdb_config fStack_790;
  char *pcStack_698;
  fdb_config *pfStack_690;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_688;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_680;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_678;
  code *pcStack_670;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_668;
  fdb_file_handle *pfStack_660;
  size_t sStack_658;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_650;
  kvs_info *pkStack_648;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_640;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_638;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_630;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_628;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_620;
  timeval tStack_618;
  undefined1 auStack_608 [24];
  fdb_file_info fStack_5f0;
  fdb_config fStack_5a8;
  fdb_config fStack_4a8;
  fdb_config *pfStack_3b0;
  fdb_kvs_handle *pfStack_3a8;
  ulong uStack_3a0;
  char *pcStack_398;
  fdb_file_info *pfStack_390;
  code *pcStack_388;
  fdb_kvs_handle *pfStack_380;
  fdb_file_handle *pfStack_378;
  fdb_kvs_handle *pfStack_370;
  fdb_config *pfStack_368;
  size_t sStack_360;
  fdb_kvs_config fStack_358;
  timeval tStack_340;
  fdb_file_info fStack_330;
  fdb_config fStack_2e8;
  fdb_config *pfStack_1f0;
  char *pcStack_1e0;
  fdb_file_info *pfStack_1d8;
  code *pcStack_1d0;
  fdb_kvs_handle *local_1c8;
  fdb_file_handle *local_1c0;
  fdb_kvs_handle *local_1b8;
  fdb_kvs_config local_1b0;
  char local_198 [24];
  timeval local_180;
  fdb_file_info local_170;
  fdb_config local_128;
  
  pcStack_1d0 = (code *)0x10c416;
  memleak_start();
  pcStack_1d0 = (code *)0x10c422;
  gettimeofday(&local_180,(__timezone_ptr_t)0x0);
  pcVar12 = (char *)&local_128;
  pcStack_1d0 = (code *)0x10c432;
  fdb_get_default_config();
  pcStack_1d0 = (code *)0x10c43c;
  fdb_get_default_kvs_config();
  pcStack_1d0 = (code *)0x10c448;
  system("rm -rf  staleblktest* > errorlog.txt");
  local_128.compaction_threshold = '\0';
  local_128.num_keeping_headers = 5;
  pcStack_1d0 = (code *)0x10c46b;
  fVar2 = fdb_open(&local_1c0,"./staleblktest1",(fdb_config *)pcVar12);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6a2;
  pcStack_1d0 = (code *)0x10c48c;
  fVar2 = fdb_kvs_open(local_1c0,&local_1c8,"num_keep",&local_1b0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6a9;
  unaff_R13 = 0;
  pcVar12 = "key";
  unaff_R14 = "val";
  unaff_R15 = (char *)&local_170;
  do {
    pcStack_1d0 = (code *)0x10c4c4;
    fVar2 = fdb_set_kv(local_1c8,"key",4,"val",4);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c68d:
      pcStack_1d0 = (code *)0x10c694;
      snapshot_after_block_reuse_test();
      goto LAB_0010c694;
    }
    pcStack_1d0 = (code *)0x10c4d9;
    fVar2 = fdb_get_file_info(local_1c0,(fdb_file_info *)unaff_R15);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1d0 = (code *)0x10c68d;
      snapshot_after_block_reuse_test();
      goto LAB_0010c68d;
    }
    unaff_R13 = unaff_R13 - 1;
  } while (local_170.file_size < 0x1000001);
  pcStack_1d0 = (code *)0x10c501;
  fVar2 = fdb_commit(local_1c0,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6b0;
  pcVar12 = "key%d";
  unaff_R14 = local_198;
  unaff_R15 = "reu";
  unaff_RBP = 0;
  do {
    pcStack_1d0 = (code *)0x10c52d;
    sprintf(unaff_R14,"key%d",unaff_RBP);
    unaff_R12 = local_1c8;
    pcStack_1d0 = (code *)0x10c539;
    sVar5 = strlen(unaff_R14);
    pcStack_1d0 = (code *)0x10c550;
    fVar2 = fdb_set_kv(unaff_R12,unaff_R14,sVar5,"reu",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c69b;
    pcStack_1d0 = (code *)0x10c567;
    fVar2 = fdb_commit(local_1c0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c694;
    uVar16 = (int)unaff_RBP + 1;
    unaff_RBP = (size_t)uVar16;
  } while (uVar16 != 10);
  pcVar12 = "key";
  unaff_R14 = "val";
  unaff_RBP = unaff_R13 & 0xffffffff;
  do {
    uVar16 = (int)unaff_RBP + 1;
    unaff_RBP = (size_t)uVar16;
    if (uVar16 == 0) goto LAB_0010c5b0;
    pcStack_1d0 = (code *)0x10c5a5;
    fVar2 = fdb_set_kv(local_1c8,"key",4,"val",4);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  pcStack_1d0 = (code *)0x10c5b0;
  snapshot_after_block_reuse_test();
LAB_0010c5b0:
  pcStack_1d0 = (code *)0x10c5bf;
  fVar2 = fdb_commit(local_1c0,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6b7;
  pcStack_1d0 = (code *)0x10c5dd;
  fVar2 = fdb_snapshot_open(local_1c8,&local_1b8,6 - unaff_R13);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6be;
  pcStack_1d0 = (code *)0x10c5ef;
  fVar2 = fdb_kvs_close(local_1b8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6c5;
  pcStack_1d0 = (code *)0x10c60d;
  fVar2 = fdb_snapshot_open(local_1c8,&local_1b8,5 - unaff_R13);
  if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c6cc;
  pcStack_1d0 = (code *)0x10c61f;
  fVar2 = fdb_kvs_close(local_1c8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6d1;
  pcStack_1d0 = (code *)0x10c631;
  fVar2 = fdb_close(local_1c0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_1d0 = (code *)0x10c63e;
    fdb_shutdown();
    pcStack_1d0 = (code *)0x10c643;
    memleak_end();
    pcVar12 = "%s PASSED\n";
    if (snapshot_after_block_reuse_test()::__test_pass != '\0') {
      pcVar12 = "%s FAILED\n";
    }
    pcStack_1d0 = (code *)0x10c674;
    fprintf(_stderr,pcVar12,"snapshot after block reuse test");
    return;
  }
  goto LAB_0010c6d8;
LAB_0010c694:
  pcStack_1d0 = (code *)0x10c69b;
  snapshot_after_block_reuse_test();
LAB_0010c69b:
  pcStack_1d0 = (code *)0x10c6a2;
  snapshot_after_block_reuse_test();
LAB_0010c6a2:
  pcStack_1d0 = (code *)0x10c6a9;
  snapshot_after_block_reuse_test();
LAB_0010c6a9:
  pcStack_1d0 = (code *)0x10c6b0;
  snapshot_after_block_reuse_test();
LAB_0010c6b0:
  pcStack_1d0 = (code *)0x10c6b7;
  snapshot_after_block_reuse_test();
LAB_0010c6b7:
  pcStack_1d0 = (code *)0x10c6be;
  snapshot_after_block_reuse_test();
LAB_0010c6be:
  pcStack_1d0 = (code *)0x10c6c5;
  snapshot_after_block_reuse_test();
LAB_0010c6c5:
  pcStack_1d0 = (code *)0x10c6cc;
  snapshot_after_block_reuse_test();
LAB_0010c6cc:
  pcStack_1d0 = (code *)0x10c6d1;
  snapshot_after_block_reuse_test();
LAB_0010c6d1:
  pcStack_1d0 = (code *)0x10c6d8;
  snapshot_after_block_reuse_test();
LAB_0010c6d8:
  pcStack_1d0 = snapshot_inmem_before_block_reuse_test;
  snapshot_after_block_reuse_test();
  pcStack_388 = (code *)0x10c6f3;
  pfStack_1f0 = (fdb_config *)pcVar12;
  pcStack_1e0 = unaff_R14;
  pfStack_1d8 = (fdb_file_info *)unaff_R15;
  pcStack_1d0 = (code *)unaff_RBP;
  memleak_start();
  pcStack_388 = (code *)0x10c6ff;
  gettimeofday(&tStack_340,(__timezone_ptr_t)0x0);
  pfVar14 = &fStack_2e8;
  pcStack_388 = (code *)0x10c70f;
  fdb_get_default_config();
  pcStack_388 = (code *)0x10c719;
  fdb_get_default_kvs_config();
  pcStack_388 = (code *)0x10c725;
  system("rm -rf  staleblktest* > errorlog.txt");
  fStack_2e8.num_keeping_headers = 1;
  pcStack_388 = (code *)0x10c744;
  fVar2 = fdb_open(&pfStack_378,"./staleblktest1",pfVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_388 = (code *)0x10c75e;
    fVar2 = fdb_kvs_open_default(pfStack_378,&pfStack_380,&fStack_358);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca0d;
    pcStack_388 = (code *)0x10c788;
    fVar2 = fdb_set_kv(pfStack_380,"key",4,"snp",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca14;
    pcStack_388 = (code *)0x10c79f;
    fVar2 = fdb_commit(pfStack_378,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca1b;
    pcStack_388 = (code *)0x10c7bc;
    fVar2 = fdb_snapshot_open(pfStack_380,&pfStack_370,0xffffffffffffffff);
    pfVar13 = pfVar14;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca22;
    unaff_RBP = 0;
    unaff_R15 = (char *)&fStack_330;
    do {
      pcStack_388 = (code *)0x10c7f3;
      fVar2 = fdb_set_kv(pfStack_380,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9da;
      pcStack_388 = (code *)0x10c808;
      fVar2 = fdb_get_file_info(pfStack_378,(fdb_file_info *)unaff_R15);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9d3;
      uVar16 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar16;
    } while (fStack_330.file_size < 0x1000001);
    unaff_R15 = (char *)0x0;
    pfVar13 = (fdb_config *)0x147599;
    unaff_R14 = "val";
    do {
      unaff_R12 = (fdb_kvs_handle *)(ulong)uVar16;
      do {
        pcStack_388 = (code *)0x10c84b;
        fVar2 = fdb_set_kv(pfStack_380,"key",4,"val",4);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pcStack_388 = (code *)0x10c9d3;
          snapshot_inmem_before_block_reuse_test();
          goto LAB_0010c9d3;
        }
        uVar21 = (int)unaff_R12 - 1;
        unaff_R12 = (fdb_kvs_handle *)(ulong)uVar21;
      } while (uVar21 != 0);
      pcStack_388 = (code *)0x10c867;
      fVar2 = fdb_commit(pfStack_378,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9e1;
      uVar21 = (int)unaff_R15 + 1;
      unaff_R15 = (char *)(ulong)uVar21;
    } while (uVar21 != 5);
    pcStack_388 = (code *)0x10c881;
    sVar3 = sb_check_block_reusing(pfStack_380);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010ca29;
    pcStack_388 = (code *)0x10c8aa;
    fVar2 = fdb_get_kv(pfStack_370,"key",4,&pfStack_368,&sStack_360);
    pfVar14 = pfStack_368;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca2e;
    pcStack_388 = (code *)0x10c8cb;
    iVar4 = bcmp(pfStack_368,"snp",sStack_360);
    if (iVar4 != 0) goto LAB_0010ca35;
    pcStack_388 = (code *)0x10c8dd;
    fVar2 = fdb_kvs_close(pfStack_370);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca3d;
    pfVar14 = (fdb_config *)0x147599;
    unaff_R14 = "val";
    do {
      pcStack_388 = (code *)0x10c90d;
      fVar2 = fdb_set_kv(pfStack_380,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9e8;
      uVar16 = (int)unaff_RBP - 1;
      unaff_RBP = (size_t)uVar16;
    } while (uVar16 != 0);
    pcStack_388 = (code *)0x10c928;
    fVar2 = fdb_commit(pfStack_378,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca44;
    pcStack_388 = (code *)0x10c943;
    fVar2 = fdb_snapshot_open(pfStack_380,&pfStack_370,1);
    if (fVar2 == FDB_RESULT_NO_DB_INSTANCE) {
      pcStack_388 = (code *)0x10c956;
      fVar2 = fdb_free_block(pfStack_368);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca4b;
      pcStack_388 = (code *)0x10c967;
      fVar2 = fdb_kvs_close(pfStack_380);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca52;
      pcStack_388 = (code *)0x10c979;
      fVar2 = fdb_close(pfStack_378);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStack_388 = (code *)0x10c986;
        fdb_shutdown();
        pcStack_388 = (code *)0x10c98b;
        memleak_end();
        pcVar12 = "%s PASSED\n";
        if (snapshot_inmem_before_block_reuse_test()::__test_pass != '\0') {
          pcVar12 = "%s FAILED\n";
        }
        pcStack_388 = (code *)0x10c9bc;
        fprintf(_stderr,pcVar12,"snapshot inmem before block reuse test");
        return;
      }
      goto LAB_0010ca59;
    }
LAB_0010c9ef:
    unaff_R14 = "val";
    pfVar14 = (fdb_config *)0x147599;
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010ca01:
      pcStack_388 = (code *)0x10ca06;
      snapshot_inmem_before_block_reuse_test();
      goto LAB_0010ca06;
    }
    pcStack_388 = (code *)0x10c9fd;
    fVar2 = fdb_kvs_close(pfStack_370);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010ca01;
  }
  else {
LAB_0010ca06:
    pcStack_388 = (code *)0x10ca0d;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca0d:
    pcStack_388 = (code *)0x10ca14;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca14:
    pcStack_388 = (code *)0x10ca1b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca1b:
    pcStack_388 = (code *)0x10ca22;
    snapshot_inmem_before_block_reuse_test();
    pfVar13 = pfVar14;
LAB_0010ca22:
    pcStack_388 = (code *)0x10ca29;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca29:
    pcStack_388 = (code *)0x10ca2e;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca2e:
    pfVar14 = pfVar13;
    pcStack_388 = (code *)0x10ca35;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca35:
    pcStack_388 = (code *)0x10ca3d;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca3d:
    pcStack_388 = (code *)0x10ca44;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca44:
    pcStack_388 = (code *)0x10ca4b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca4b:
    pcStack_388 = (code *)0x10ca52;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca52:
    pcStack_388 = (code *)0x10ca59;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca59:
    pcStack_388 = (code *)0x10ca60;
    snapshot_inmem_before_block_reuse_test();
  }
  pcStack_388 = variable_value_size_test;
  snapshot_inmem_before_block_reuse_test();
  aVar23.seqtree = (btree *)0x0;
  pcStack_670 = (code *)0x10ca87;
  pfStack_3b0 = pfVar14;
  pfStack_3a8 = unaff_R12;
  uStack_3a0 = unaff_R13;
  pcStack_398 = unaff_R14;
  pfStack_390 = (fdb_file_info *)unaff_R15;
  pcStack_388 = (code *)unaff_RBP;
  gettimeofday(&tStack_618,(__timezone_ptr_t)0x0);
  pcStack_670 = (code *)0x10ca8c;
  memleak_start();
  pcStack_670 = (code *)0x10ca96;
  pcVar6 = (char *)operator_new__(0x500000);
  pcVar12 = auStack_608;
  pcStack_670 = (code *)0x10caa6;
  fdb_get_default_kvs_config();
  pfVar14 = &fStack_4a8;
  pcStack_670 = (code *)0x10cab6;
  fdb_get_default_config();
  fStack_4a8.compaction_threshold = '\0';
  fStack_4a8.block_reusing_threshold = 0x41;
  pcStack_670 = (code *)0x10cad4;
  system("rm -rf  staleblktest* > errorlog.txt");
  handle.seqtree = (btree *)&pfStack_660;
  pcStack_670 = (code *)0x10caeb;
  fdb_open((fdb_file_handle **)handle.seqtree,"./staleblktest1",pfVar14);
  pcStack_670 = (code *)0x10cafa;
  fdb_kvs_open_default(pfStack_660,(fdb_kvs_handle **)&aStack_668.seqtree,(fdb_kvs_config *)pcVar12)
  ;
  if (fStack_4a8.num_keeping_headers != 0xffffffffffffffff) {
    pcVar22 = "%d_key";
    pcVar12 = (char *)&fStack_5a8;
    aVar23.seqtree = (btree *)0x0;
    iVar4 = 0;
    do {
      sStack_658 = CONCAT44(sStack_658._4_4_,iVar4 + 3);
      pfVar14 = (fdb_config *)0x1ff;
      aStack_650 = aVar23;
      do {
        pcStack_670 = (code *)0x10cb40;
        sprintf(pcVar12,"%d_key",(ulong)((int)pfVar14 + 1));
        pcStack_670 = (code *)0x10cb50;
        memset(pcVar6,0x61,(size_t)pfVar14);
        handle = aStack_668;
        pcVar6[(long)pfVar14] = '\0';
        pcStack_670 = (code *)0x10cb61;
        sVar5 = strlen(pcVar12);
        unaff_RBP = sVar5 + 1;
        pcStack_670 = (code *)0x10cb6d;
        sVar5 = strlen(pcVar6);
        pcStack_670 = (code *)0x10cb82;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)handle.seqtree,pcVar12,unaff_RBP,pcVar6,sVar5 + 1);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d063;
        pfVar14 = (fdb_config *)&pfVar14[2].wal_threshold;
      } while (pfVar14 != (fdb_config *)0x7ff);
      pcStack_670 = (code *)0x10cba9;
      fVar2 = fdb_commit(pfStack_660,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d071;
      aVar23.seqtree = (btree *)&(aStack_650.seqtree)->vsize;
      iVar4 = (int)sStack_658;
    } while (aVar23.seqtree < (undefined1 *)(fStack_4a8.num_keeping_headers + 1));
    aVar23 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(long)(int)sStack_658;
  }
  pcStack_670 = (code *)0x10cbe5;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_668.seqtree,
                            (fdb_kvs_handle **)&aStack_630.seqtree,(fdb_seqnum_t)aVar23);
  sVar19 = unaff_RBP;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    sVar7 = 0xffffffff;
    pcVar12 = "%d_key";
    pfVar14 = &fStack_5a8;
    handle.seqtree = (btree *)0x0;
LAB_0010cc04:
    unaff_RBP = 0x3ff;
    sStack_658 = sVar7;
    aStack_650 = handle;
LAB_0010cc13:
    pcStack_670 = (code *)0x10cc23;
    sprintf((char *)pfVar14,"%d_key",(ulong)((int)unaff_RBP + 1));
    pcStack_670 = (code *)0x10cc33;
    memset(pcVar6,0x62,unaff_RBP);
    handle = aStack_668;
    pcVar6[unaff_RBP] = '\0';
    pcStack_670 = (code *)0x10cc43;
    sVar5 = strlen((char *)pfVar14);
    pcVar22 = (char *)(sVar5 + 1);
    pcStack_670 = (code *)0x10cc4f;
    sVar5 = strlen(pcVar6);
    pcStack_670 = (code *)0x10cc64;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle.seqtree,pfVar14,(size_t)pcVar22,pcVar6,sVar5 + 1);
    if (fVar2 == FDB_RESULT_SUCCESS) goto code_r0x0010cc6c;
    pcStack_670 = (code *)0x10d063;
    variable_value_size_test();
LAB_0010d063:
    pcStack_670 = (code *)0x10d06a;
    variable_value_size_test();
    goto LAB_0010d06a;
  }
LAB_0010d086:
  pcStack_670 = (code *)0x10d08d;
  variable_value_size_test();
LAB_0010d08d:
  pcStack_670 = (code *)0x10d092;
  variable_value_size_test();
LAB_0010d092:
  pcStack_670 = (code *)0x10d099;
  variable_value_size_test();
LAB_0010d099:
  pcStack_670 = (code *)0x10d0a0;
  variable_value_size_test();
LAB_0010d0a0:
  pcStack_670 = (code *)0x10d0a7;
  variable_value_size_test();
LAB_0010d0a7:
  pcStack_670 = (code *)0x10d0ae;
  variable_value_size_test();
LAB_0010d0ae:
  pcStack_670 = (code *)0x10d0b5;
  variable_value_size_test();
LAB_0010d0b5:
  aVar24 = aVar23;
  pcStack_670 = (code *)0x10d0bc;
  variable_value_size_test();
LAB_0010d0bc:
  pcStack_670 = (code *)0x10d0c4;
  variable_value_size_test();
LAB_0010d0c4:
  pcStack_670 = (code *)0x10d0cb;
  variable_value_size_test();
LAB_0010d0cb:
  pcStack_670 = (code *)0x10d0d2;
  variable_value_size_test();
LAB_0010d0d2:
  pcStack_670 = (code *)0x10d0da;
  variable_value_size_test();
LAB_0010d0da:
  pcStack_670 = (code *)0x10d0e1;
  variable_value_size_test();
LAB_0010d0e1:
  pcStack_670 = (code *)0x10d0e8;
  variable_value_size_test();
LAB_0010d0e8:
  pcStack_670 = (code *)0x10d0ef;
  variable_value_size_test();
LAB_0010d0ef:
  pcStack_670 = (code *)0x10d0f6;
  variable_value_size_test();
LAB_0010d0f6:
  pcStack_670 = rollback_with_num_keeping_headers;
  variable_value_size_test();
  pcStack_d48 = (code *)0x10d11a;
  pcStack_698 = pcVar6;
  pfStack_690 = pfVar14;
  aStack_688 = handle;
  aStack_680 = aVar24;
  aStack_678 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar12;
  pcStack_670 = (code *)sVar19;
  gettimeofday(&tStack_d00,(__timezone_ptr_t)0x0);
  pcStack_d48 = (code *)0x10d11f;
  memleak_start();
  pcStack_d48 = (code *)0x10d12c;
  fdb_get_default_kvs_config();
  pcStack_d48 = (code *)0x10d13c;
  fdb_get_default_config();
  fStack_790.compaction_threshold = '\0';
  fStack_790.block_reusing_threshold = 0x41;
  fStack_790.num_keeping_headers = 1;
  pcStack_d48 = (code *)0x10d163;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_d48 = (code *)0x10d17a;
  fdb_open(&pfStack_d38,"./staleblktest1",&fStack_790);
  pcStack_d48 = (code *)0x10d188;
  fdb_kvs_open_default(pfStack_d38,&pfStack_d40,&fStack_cf0);
  pcVar15 = "%dkey";
  pcVar6 = acStack_c90;
  pcVar22 = acStack_b90;
  pcVar12 = (char *)0x0;
  do {
    pcStack_d48 = (code *)0x10d1b0;
    sprintf(pcVar6,"%dkey",pcVar12);
    pcStack_d48 = (code *)0x10d1c2;
    memset(pcVar22,0x62,0x1ff);
    pfVar20 = pfStack_d40;
    uStack_991 = 0;
    pcStack_d48 = (code *)0x10d1d6;
    sVar8 = strlen(pcVar6);
    pcStack_d48 = (code *)0x10d1e1;
    sVar5 = strlen(pcVar22);
    pcStack_d48 = (code *)0x10d1f5;
    fVar2 = fdb_set_kv(pfVar20,pcVar6,sVar8,pcVar22,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010d445:
      pcStack_d48 = (code *)0x10d44c;
      rollback_with_num_keeping_headers();
      goto LAB_0010d44c;
    }
    pcStack_d48 = (code *)0x10d20c;
    fVar2 = fdb_commit(pfStack_d38,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_d48 = (code *)0x10d445;
      rollback_with_num_keeping_headers();
      goto LAB_0010d445;
    }
    uVar16 = (int)pcVar12 + 1;
    pcVar12 = (char *)(ulong)uVar16;
  } while (uVar16 != 10);
  pcVar22 = (char *)0x0;
  pcVar12 = acStack_c90;
  pcVar6 = acStack_b90;
  pcVar15 = (char *)0x0;
  do {
    pfVar20 = pfStack_d40;
    builtin_strncpy(acStack_c90,"0key",5);
    builtin_strncpy(acStack_b90,
                    "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                    ,0x80);
    pcStack_d48 = (code *)0x10d29e;
    sVar8 = strlen(pcVar12);
    pcStack_d48 = (code *)0x10d2a9;
    sVar5 = strlen(pcVar6);
    pcStack_d48 = (code *)0x10d2bd;
    fVar2 = fdb_set_kv(pfVar20,pcVar12,sVar8,pcVar6,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d453;
    pcStack_d48 = (code *)0x10d2d4;
    fVar2 = fdb_get_file_info(pfStack_d38,&fStack_cd8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d44c;
    uVar16 = (int)pcVar15 + 1;
    pcVar15 = (char *)(ulong)uVar16;
  } while (fStack_cd8.file_size < 0x1000000);
  pcStack_d48 = (code *)0x10d2f9;
  sVar3 = sb_check_block_reusing(pfStack_d40);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_d48 = (code *)0x10d311;
    fVar2 = fdb_commit(pfStack_d38,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d466;
    pcVar6 = acStack_c90;
    pcVar22 = acStack_b90;
    pcVar12 = (char *)0x0;
    do {
      pcStack_d48 = (code *)0x10d33e;
      sprintf(pcVar6,"%dkey",pcVar12);
      pcStack_d48 = (code *)0x10d350;
      memset(pcVar22,100,0x1ff);
      pfVar20 = pfStack_d40;
      uStack_991 = 0;
      pcStack_d48 = (code *)0x10d364;
      sVar8 = strlen(pcVar6);
      pcStack_d48 = (code *)0x10d36f;
      sVar5 = strlen(pcVar22);
      pcStack_d48 = (code *)0x10d383;
      fVar2 = fdb_set_kv(pfVar20,pcVar6,sVar8,pcVar22,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d45a;
      uVar21 = (int)pcVar12 + 1;
      pcVar12 = (char *)(ulong)uVar21;
    } while (uVar16 != uVar21);
    pcStack_d48 = (code *)0x10d39e;
    fVar2 = fdb_rollback(&pfStack_d40,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d46d;
    pcStack_d48 = (code *)0x10d3b4;
    fVar2 = fdb_get_kvs_info(pfStack_d40,&fStack_d30);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d474;
    if (fStack_d30.doc_count != 10) {
      pcStack_d48 = (code *)0x10d3ce;
      rollback_with_num_keeping_headers();
    }
    pcStack_d48 = (code *)0x10d3d7;
    fVar2 = fdb_kvs_close(pfStack_d40);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d47b;
    pcStack_d48 = (code *)0x10d3e9;
    fVar2 = fdb_close(pfStack_d38);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_d48 = (code *)0x10d3f6;
      fdb_shutdown();
      pcStack_d48 = (code *)0x10d3fb;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (rollback_with_num_keeping_headers()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pcStack_d48 = (code *)0x10d42c;
      fprintf(_stderr,pcVar12,"rollback with num keeping headers");
      return;
    }
  }
  else {
LAB_0010d461:
    pcStack_d48 = (code *)0x10d466;
    rollback_with_num_keeping_headers();
LAB_0010d466:
    pcStack_d48 = (code *)0x10d46d;
    rollback_with_num_keeping_headers();
LAB_0010d46d:
    pcStack_d48 = (code *)0x10d474;
    rollback_with_num_keeping_headers();
LAB_0010d474:
    pcStack_d48 = (code *)0x10d47b;
    rollback_with_num_keeping_headers();
LAB_0010d47b:
    pcStack_d48 = (code *)0x10d482;
    rollback_with_num_keeping_headers();
  }
  pcStack_d48 = crash_and_recover_with_num_keeping_test;
  rollback_with_num_keeping_headers();
  pcStack_1230 = (code *)0x10d4a6;
  fStack_f68.bub_ctx.space_used = (uint64_t)pcVar15;
  sStack_d60 = sVar8;
  pcStack_d58 = pcVar6;
  pcStack_d50 = pcVar22;
  pcStack_d48 = (code *)pcVar12;
  gettimeofday(&tStack_11f0,(__timezone_ptr_t)0x0);
  pcStack_1230 = (code *)0x10d4ab;
  memleak_start();
  pcStack_1230 = (code *)0x10d4b8;
  fdb_get_default_kvs_config();
  pcStack_1230 = (code *)0x10d4c8;
  fdb_get_default_config();
  fStack_f68.config.block_reusing_threshold._7_1_ = 0;
  fStack_f68.max_seqnum = 0x41;
  fStack_f68.handle_busy.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0xa
  ;
  fStack_f68.dirty_updates = '\0';
  fStack_f68._466_6_ = 0;
  pcStack_1230 = (code *)0x10d4ef;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_1230 = (code *)0x10d506;
  fdb_open(&pfStack_1220,"./staleblktest1file.1",(fdb_config *)&fStack_f68.config.encryption_key);
  pcStack_1230 = (code *)0x10d51b;
  fdb_kvs_open(pfStack_1220,&pfStack_1228,"./staleblktest1",&fStack_1208);
  pcVar6 = "%dkey";
  pfVar20 = &fStack_f68;
  pfVar11 = (fdb_kvs_handle *)auStack_1168;
  pcVar12 = (char *)0x0;
  do {
    pcStack_1230 = (code *)0x10d543;
    sprintf((char *)pfVar20,"%dkey",pcVar12);
    pcStack_1230 = (code *)0x10d555;
    memset(pfVar11,0x62,0x1ff);
    pfVar10 = pfStack_1228;
    auStack_1168[0x1ff] = 0;
    pcStack_1230 = (code *)0x10d569;
    pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar20);
    pcStack_1230 = (code *)0x10d574;
    sVar5 = strlen((char *)pfVar11);
    pcStack_1230 = (code *)0x10d588;
    fVar2 = fdb_set_kv(pfVar10,pfVar20,(size_t)pfVar9,pfVar11,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010d9e8:
      pcStack_1230 = (code *)0x10d9ef;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010d9ef;
    }
    pcStack_1230 = (code *)0x10d59f;
    fVar2 = fdb_commit(pfStack_1220,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1230 = (code *)0x10d9e8;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010d9e8;
    }
    uVar16 = (int)pcVar12 + 1;
    pcVar12 = (char *)(ulong)uVar16;
  } while (uVar16 != 0xb);
  pfVar11 = (fdb_kvs_handle *)0x0;
  pcVar6 = (char *)&fStack_f68;
  pcVar12 = auStack_1168;
  pfVar20 = (fdb_kvs_handle *)0x0;
  do {
    pfVar10 = pfStack_1228;
    fStack_f68.kvs_config._4_1_ = 0;
    fStack_f68.kvs_config.create_if_missing = true;
    fStack_f68.kvs_config._1_3_ = 0x79656b;
    auStack_1168._0_8_ = 0x6363636363636363;
    auStack_1168._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1168._16_8_ = (void *)0x6363636363636363;
    auStack_1168._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1168._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1168._40_7_ = 0x63636363636363;
    auStack_1168[0x2f] = 99;
    auStack_1168._48_7_ = 0x63636363636363;
    auStack_1168[0x37] = 99;
    auStack_1168._56_7_ = 0x63636363636363;
    auStack_1168[0x3f] = 99;
    auStack_1168._64_8_ = (btree *)0x6363636363636363;
    auStack_1168._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1168._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1168._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1168._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1168._104_7_ = 0x63636363636363;
    auStack_1168[0x6f] = 99;
    auStack_1168._112_7_ = 0x63636363636363;
    auStack_1168._119_8_ = 0x6363636363636363;
    auStack_1168[0x7f] = 0;
    pcStack_1230 = (code *)0x10d632;
    pfVar9 = (fdb_kvs_handle *)strlen(pcVar6);
    pcStack_1230 = (code *)0x10d63d;
    sVar5 = strlen(pcVar12);
    pcStack_1230 = (code *)0x10d651;
    fVar2 = fdb_set_kv(pfVar10,pcVar6,(size_t)pfVar9,pcVar12,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d9f6;
    pcStack_1230 = (code *)0x10d668;
    fVar2 = fdb_get_file_info(pfStack_1220,&fStack_11e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d9ef;
    pfVar20 = (fdb_kvs_handle *)(ulong)((int)pfVar20 + 1);
  } while (fStack_11e0.file_size < 0x1000000);
  pcStack_1230 = (code *)0x10d68b;
  sVar3 = sb_check_block_reusing(pfStack_1228);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_1230 = (code *)0x10d6a3;
    fVar2 = fdb_commit(pfStack_1220,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da25;
    pcStack_1230 = (code *)0x10d6bc;
    fVar2 = fdb_get_kvs_info(pfStack_1228,&fStack_1198);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da2c;
    pfStack_1218 = (fdb_kvs_handle *)fStack_1198.last_seqnum;
    pfVar11 = &fStack_f68;
    pfVar10 = (fdb_kvs_handle *)auStack_1168;
    pcVar12 = (char *)0x0;
    do {
      pcStack_1230 = (code *)0x10d6f6;
      sprintf((char *)pfVar11,"%dkey",pcVar12);
      pfVar9 = pfStack_1228;
      auStack_1168._0_8_ = 0x6464646464646464;
      auStack_1168._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
      auStack_1168._16_8_ = (void *)0x6464646464646464;
      auStack_1168._24_8_ = (kvs_info *)0x6464646464646464;
      auStack_1168._32_8_ = (kvs_ops_stat *)0x6464646464646464;
      auStack_1168._40_7_ = 0x64646464646464;
      auStack_1168[0x2f] = 100;
      auStack_1168._48_7_ = 0x64646464646464;
      auStack_1168[0x37] = 100;
      auStack_1168._56_7_ = 0x64646464646464;
      auStack_1168[0x3f] = 0;
      pcStack_1230 = (code *)0x10d731;
      pcVar6 = (char *)strlen((char *)pfVar11);
      pcStack_1230 = (code *)0x10d73c;
      sVar5 = strlen((char *)pfVar10);
      pcStack_1230 = (code *)0x10d750;
      fVar2 = fdb_set_kv(pfVar9,pfVar11,(size_t)pcVar6,pfVar10,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da04;
      pcStack_1230 = (code *)0x10d767;
      fVar2 = fdb_commit(pfStack_1220,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d9fd;
      uVar16 = (int)pcVar12 + 1;
      pcVar12 = (char *)(ulong)uVar16;
    } while (uVar16 != 10);
    pcStack_1230 = (code *)0x10d783;
    fVar2 = fdb_kvs_close(pfStack_1228);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da33;
    pcStack_1230 = (code *)0x10d795;
    fVar2 = fdb_close(pfStack_1220);
    pcVar6 = (char *)pfStack_1218;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da3a;
    pcStack_1230 = (code *)0x10d7a7;
    fdb_shutdown();
    pcStack_1230 = (code *)0x10d7c0;
    fVar2 = fdb_open(&pfStack_1220,"./staleblktest1file.1",
                     (fdb_config *)&fStack_f68.config.encryption_key);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da41;
    pcStack_1230 = (code *)0x10d7e1;
    fdb_kvs_open(pfStack_1220,&pfStack_1228,"./staleblktest1",&fStack_1208);
    pcStack_1230 = (code *)0x10d7f0;
    fVar2 = fdb_get_file_info(pfStack_1220,&fStack_11e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da48;
    pcStack_1230 = (code *)0x10d818;
    iVar4 = _disk_dump("./staleblktest1file.1",fStack_11e0.file_size,
                       (ulong)(((uint)fStack_f68.config.encryption_key.bytes._0_4_ >> 2) +
                              fStack_f68.config.encryption_key.bytes._0_4_ * 2));
    if (iVar4 < 0) goto LAB_0010da4f;
    pcStack_1230 = (code *)0x10d831;
    fVar2 = fdb_snapshot_open(pfStack_1228,&pfStack_1210,(fdb_seqnum_t)pcVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da54;
    pcStack_1230 = (code *)0x10d844;
    fVar2 = fdb_rollback(&pfStack_1228,(fdb_seqnum_t)pcVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da5b;
    pcStack_1230 = (code *)0x10d85d;
    fVar2 = fdb_compact(pfStack_1220,"./staleblktest1file.3");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da62;
    pcVar6 = "%dkey";
    pfVar10 = &fStack_f68;
    pcVar12 = (char *)0x0;
    do {
      pcStack_1230 = (code *)0x10d885;
      sprintf((char *)pfVar10,"%dkey",pcVar12);
      pfVar11 = pfStack_1228;
      pcStack_1230 = (code *)0x10d891;
      sVar5 = strlen((char *)pfVar10);
      pcStack_1230 = (code *)0x10d89f;
      fVar2 = fdb_del_kv(pfVar11,pfVar10,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da12;
      pcStack_1230 = (code *)0x10d8b6;
      fVar2 = fdb_commit(pfStack_1220,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da0b;
      uVar16 = (int)pcVar12 + 1;
      pcVar12 = (char *)(ulong)uVar16;
    } while (uVar16 != 0xb);
    pcStack_1230 = (code *)0x10d8ce;
    sVar3 = sb_check_block_reusing(pfStack_1228);
    if (sVar3 != SBD_NONE) goto LAB_0010da69;
    pcVar12 = (char *)0x0;
    pcVar6 = auStack_1168;
    pfVar9 = &fStack_f68;
    do {
      fStack_f68.kvs_config._4_1_ = 0;
      fStack_f68.kvs_config.create_if_missing = true;
      fStack_f68.kvs_config._1_3_ = 0x79656b;
      pcStack_1230 = (code *)0x10d90d;
      memset(pcVar6,0x65,0x1ff);
      pfVar11 = pfStack_1228;
      auStack_1168[0x1ff] = 0;
      pcStack_1230 = (code *)0x10d921;
      pfVar10 = (fdb_kvs_handle *)strlen((char *)pfVar9);
      pcStack_1230 = (code *)0x10d92c;
      sVar5 = strlen(pcVar6);
      pcStack_1230 = (code *)0x10d940;
      fVar2 = fdb_set_kv(pfVar11,pfVar9,(size_t)pfVar10,pcVar6,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da19;
      uVar16 = (int)pfVar20 - 1;
      pfVar20 = (fdb_kvs_handle *)(ulong)uVar16;
    } while (uVar16 != 0);
    pcStack_1230 = (code *)0x10d956;
    sVar3 = sb_check_block_reusing(pfStack_1228);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010da6e;
    pcStack_1230 = (code *)0x10d969;
    fVar2 = fdb_kvs_close(pfStack_1210);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da73;
    pcStack_1230 = (code *)0x10d97a;
    fVar2 = fdb_kvs_close(pfStack_1228);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da7a;
    pcStack_1230 = (code *)0x10d98c;
    fVar2 = fdb_close(pfStack_1220);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_1230 = (code *)0x10d999;
      fdb_shutdown();
      pcStack_1230 = (code *)0x10d99e;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (crash_and_recover_with_num_keeping_test()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pcStack_1230 = (code *)0x10d9cf;
      fprintf(_stderr,pcVar12,"crash and recover with num keeping test");
      return;
    }
  }
  else {
LAB_0010da20:
    pcStack_1230 = (code *)0x10da25;
    crash_and_recover_with_num_keeping_test();
LAB_0010da25:
    pcStack_1230 = (code *)0x10da2c;
    crash_and_recover_with_num_keeping_test();
LAB_0010da2c:
    pcStack_1230 = (code *)0x10da33;
    crash_and_recover_with_num_keeping_test();
LAB_0010da33:
    pcStack_1230 = (code *)0x10da3a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da3a:
    pcStack_1230 = (code *)0x10da41;
    crash_and_recover_with_num_keeping_test();
LAB_0010da41:
    pcStack_1230 = (code *)0x10da48;
    crash_and_recover_with_num_keeping_test();
LAB_0010da48:
    pcStack_1230 = (code *)0x10da4f;
    crash_and_recover_with_num_keeping_test();
LAB_0010da4f:
    pcStack_1230 = (code *)0x10da54;
    crash_and_recover_with_num_keeping_test();
LAB_0010da54:
    pcStack_1230 = (code *)0x10da5b;
    crash_and_recover_with_num_keeping_test();
LAB_0010da5b:
    pcStack_1230 = (code *)0x10da62;
    crash_and_recover_with_num_keeping_test();
LAB_0010da62:
    pcStack_1230 = (code *)0x10da69;
    crash_and_recover_with_num_keeping_test();
LAB_0010da69:
    pcStack_1230 = (code *)0x10da6e;
    crash_and_recover_with_num_keeping_test();
LAB_0010da6e:
    pcStack_1230 = (code *)0x10da73;
    crash_and_recover_with_num_keeping_test();
LAB_0010da73:
    pcStack_1230 = (code *)0x10da7a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da7a:
    pcStack_1230 = (code *)0x10da81;
    crash_and_recover_with_num_keeping_test();
  }
  pcStack_1230 = reuse_on_delete_test;
  crash_and_recover_with_num_keeping_test();
  pfStack_16d8 = (fdb_kvs_handle *)0x10daa5;
  pfStack_1258 = (fdb_kvs_handle *)pcVar6;
  pfStack_1250 = pfVar10;
  pfStack_1248 = pfVar9;
  pfStack_1240 = pfVar20;
  pfStack_1238 = pfVar11;
  pcStack_1230 = (code *)pcVar12;
  gettimeofday(&tStack_16c0,(__timezone_ptr_t)0x0);
  pfStack_16d8 = (fdb_kvs_handle *)0x10daaa;
  memleak_start();
  pfStack_16d8 = (fdb_kvs_handle *)0x10daba;
  fdb_get_default_kvs_config();
  pfStack_16d8 = (fdb_kvs_handle *)0x10daca;
  fdb_get_default_config();
  uStack_1321 = 0;
  pfStack_1298 = (fdb_kvs_handle *)0x41;
  uStack_1280 = 10;
  pfStack_16d8 = (fdb_kvs_handle *)0x10daf1;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_16d8 = (fdb_kvs_handle *)0x10db08;
  fdb_open(&pfStack_16c8,"./staleblktest1",(fdb_config *)(auStack_1498 + 0x148));
  pfStack_16d8 = (fdb_kvs_handle *)0x10db16;
  fdb_kvs_open_default(pfStack_16c8,&pfStack_16d0,(fdb_kvs_config *)(auStack_16b0 + 0x200));
  pcVar22 = "%dkey";
  pcVar6 = auStack_1498 + 0x48;
  pcVar12 = auStack_16b0;
  pfVar20 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_16d8 = (fdb_kvs_handle *)0x10db3b;
    sprintf(pcVar6,"%dkey",pfVar20);
    pfStack_16d8 = (fdb_kvs_handle *)0x10db4d;
    memset(pcVar12,0x62,0x1ff);
    pfVar11 = pfStack_16d0;
    auStack_16b0[0x1ff] = 0;
    pfStack_16d8 = (fdb_kvs_handle *)0x10db61;
    pfVar10 = (fdb_kvs_handle *)strlen(pcVar6);
    pfStack_16d8 = (fdb_kvs_handle *)0x10db6c;
    sVar5 = strlen(pcVar12);
    pfStack_16d8 = (fdb_kvs_handle *)0x10db80;
    fVar2 = fdb_set_kv(pfVar11,pcVar6,(size_t)pfVar10,pcVar12,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010de19:
      pfStack_16d8 = (fdb_kvs_handle *)0x10de20;
      reuse_on_delete_test();
      goto LAB_0010de20;
    }
    pfStack_16d8 = (fdb_kvs_handle *)0x10db97;
    fVar2 = fdb_commit(pfStack_16c8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_16d8 = (fdb_kvs_handle *)0x10de19;
      reuse_on_delete_test();
      goto LAB_0010de19;
    }
    uVar16 = (int)pfVar20 + 1;
    pfVar20 = (fdb_kvs_handle *)(ulong)uVar16;
  } while (uVar16 != 0xb);
  pcVar12 = auStack_1498 + 0x48;
  pfVar11 = (fdb_kvs_handle *)auStack_16b0;
  pfVar10 = (fdb_kvs_handle *)auStack_1498;
  pcVar22 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfVar9 = (fdb_kvs_handle *)pcVar22;
    pfStack_16d8 = (fdb_kvs_handle *)0x10dbd0;
    sprintf(pcVar12,"%dkey",pfVar9);
    pfVar20 = pfStack_16d0;
    auStack_16b0._0_8_ = 0x6363636363636363;
    auStack_16b0._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_16b0._16_8_ = (void *)0x6363636363636363;
    auStack_16b0._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_16b0._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_16b0._40_8_ = (fdb_file_handle *)0x6363636363636363;
    auStack_16b0._48_8_ = (hbtrie *)0x6363636363636363;
    auStack_16b0._56_8_ = (btree *)0x6363636363636363;
    auStack_16b0._64_8_ = (btree *)0x6363636363636363;
    auStack_16b0._72_8_ = (filemgr *)0x6363636363636363;
    auStack_16b0._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_16b0._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_16b0._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_16b0._104_7_ = 0x63636363636363;
    auStack_16b0[0x6f] = 99;
    auStack_16b0._112_7_ = 0x63636363636363;
    auStack_16b0._119_8_ = 0x6363636363636363;
    auStack_16b0[0x7f] = 0;
    pfStack_16d8 = (fdb_kvs_handle *)0x10dc19;
    pcVar6 = (char *)strlen(pcVar12);
    pfStack_16d8 = (fdb_kvs_handle *)0x10dc24;
    sVar5 = strlen((char *)pfVar11);
    pfStack_16d8 = (fdb_kvs_handle *)0x10dc38;
    fVar2 = fdb_set_kv(pfVar20,pcVar12,(size_t)pcVar6,pfVar11,sVar5);
    pcVar22 = (char *)pfVar9;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de27;
    pfStack_16d8 = (fdb_kvs_handle *)0x10dc4d;
    fVar2 = fdb_get_file_info(pfStack_16c8,(fdb_file_info *)pfVar10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de20;
    uVar16 = (uint)pfVar9 + 1;
    pcVar22 = (char *)(ulong)uVar16;
  } while ((ulong)auStack_1498._40_8_ < (fdb_file_handle *)0x1000000);
  pfStack_16d8 = (fdb_kvs_handle *)0x10dc72;
  sVar3 = sb_check_block_reusing(pfStack_16d0);
  if (sVar3 == SBD_NONE) {
    pfStack_16d8 = (fdb_kvs_handle *)0x10dc89;
    fVar2 = fdb_commit(pfStack_16c8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de41;
    pcVar6 = "%dkey";
    pcVar12 = auStack_1498 + 0x48;
    pfVar20 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_16d8 = (fdb_kvs_handle *)0x10dcb5;
      sprintf(pcVar12,"%dkey",pfVar20);
      pfVar11 = pfStack_16d0;
      pfStack_16d8 = (fdb_kvs_handle *)0x10dcc1;
      sVar5 = strlen(pcVar12);
      pfStack_16d8 = (fdb_kvs_handle *)0x10dccf;
      fVar2 = fdb_del_kv(pfVar11,pcVar12,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de2e;
      uVar21 = (int)pfVar20 + 1;
      pfVar20 = (fdb_kvs_handle *)(ulong)uVar21;
    } while (uVar16 != uVar21);
    pfStack_16d8 = (fdb_kvs_handle *)0x10dce6;
    sVar3 = sb_check_block_reusing(pfStack_16d0);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de48;
    if (2 < (uint)pfVar9) {
      pcVar22 = (char *)(ulong)(uVar16 >> 2);
      pcVar12 = auStack_1498 + 0x48;
      pfVar11 = (fdb_kvs_handle *)auStack_16b0;
      pfVar20 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_16d8 = (fdb_kvs_handle *)0x10dd1e;
        sprintf(pcVar12,"%dkey",pfVar20);
        pfVar9 = pfStack_16d0;
        auStack_16b0._0_8_ = 0x6464646464646464;
        auStack_16b0._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
        auStack_16b0._16_8_ = (void *)0x6464646464646464;
        auStack_16b0._24_8_ = (kvs_info *)0x6464646464646464;
        auStack_16b0._32_8_ = (kvs_ops_stat *)0x6464646464646464;
        auStack_16b0._40_8_ = (fdb_file_handle *)0x6464646464646464;
        auStack_16b0._48_8_ = (hbtrie *)0x6464646464646464;
        auStack_16b0._56_8_ = (btree *)0x6464646464646464;
        auStack_16b0._64_8_ = (btree *)0x6464646464646464;
        auStack_16b0._72_8_ = (filemgr *)0x6464646464646464;
        auStack_16b0._80_8_ = (docio_handle *)0x6464646464646464;
        auStack_16b0._88_8_ = (btreeblk_handle *)0x6464646464646464;
        auStack_16b0._96_8_ = (btree_blk_ops *)0x6464646464646464;
        auStack_16b0._104_7_ = 0x64646464646464;
        auStack_16b0[0x6f] = 100;
        auStack_16b0._112_7_ = 0x64646464646464;
        auStack_16b0._119_8_ = 0x6464646464646464;
        auStack_16b0[0x7f] = 0;
        pfStack_16d8 = (fdb_kvs_handle *)0x10dd67;
        pcVar6 = (char *)strlen(pcVar12);
        pfStack_16d8 = (fdb_kvs_handle *)0x10dd72;
        sVar5 = strlen((char *)pfVar11);
        pfStack_16d8 = (fdb_kvs_handle *)0x10dd86;
        fVar2 = fdb_set_kv(pfVar9,pcVar12,(size_t)pcVar6,pfVar11,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de35;
        uVar21 = (int)pfVar20 + 2;
        pfVar20 = (fdb_kvs_handle *)(ulong)uVar21;
      } while (uVar21 < uVar16 >> 2);
    }
    pcVar12 = auStack_1498 + 0x48;
    pfStack_16d8 = (fdb_kvs_handle *)0x10dda2;
    sVar3 = sb_check_block_reusing(pfStack_16d0);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de4d;
    pfStack_16d8 = (fdb_kvs_handle *)0x10ddb5;
    fVar2 = fdb_close(pfStack_16c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de52;
    pfStack_16d8 = (fdb_kvs_handle *)0x10ddc2;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_16d8 = (fdb_kvs_handle *)0x10ddcf;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (reuse_on_delete_test()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pfStack_16d8 = (fdb_kvs_handle *)0x10de00;
      fprintf(_stderr,pcVar12,"reuse on delete test");
      return;
    }
  }
  else {
LAB_0010de3c:
    pfStack_16d8 = (fdb_kvs_handle *)0x10de41;
    reuse_on_delete_test();
LAB_0010de41:
    pfVar9 = pfVar10;
    pfStack_16d8 = (fdb_kvs_handle *)0x10de48;
    reuse_on_delete_test();
LAB_0010de48:
    pfStack_16d8 = (fdb_kvs_handle *)0x10de4d;
    reuse_on_delete_test();
LAB_0010de4d:
    pfStack_16d8 = (fdb_kvs_handle *)0x10de52;
    reuse_on_delete_test();
LAB_0010de52:
    pfStack_16d8 = (fdb_kvs_handle *)0x10de59;
    reuse_on_delete_test();
  }
  pfStack_16d8 = (fdb_kvs_handle *)fragmented_reuse_test;
  reuse_on_delete_test();
  pfStack_1bc0 = (fdb_kvs_handle *)0x10de7d;
  fStack_18f8.bub_ctx.space_used = (uint64_t)pcVar22;
  fStack_18f8.bub_ctx.handle = pfVar11;
  pfStack_16f0 = pfVar9;
  pcStack_16e8 = pcVar6;
  pcStack_16e0 = pcVar12;
  pfStack_16d8 = pfVar20;
  gettimeofday(&tStack_1b68,(__timezone_ptr_t)0x0);
  pfStack_1bc0 = (fdb_kvs_handle *)0x10de82;
  memleak_start();
  pfStack_1bc0 = (fdb_kvs_handle *)0x10de8f;
  fdb_get_default_kvs_config();
  pfStack_1bc0 = (fdb_kvs_handle *)0x10de9f;
  fdb_get_default_config();
  fStack_18f8.config.block_reusing_threshold._7_1_ = 0;
  fStack_18f8.max_seqnum = 0x23;
  fStack_18f8.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_18f8.dirty_updates = '\0';
  fStack_18f8._466_6_ = 0;
  pfStack_1bc0 = (fdb_kvs_handle *)0x10dec6;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_1bc0 = (fdb_kvs_handle *)0x10dedd;
  fdb_open(&pfStack_1ba8,"./staleblktest1",(fdb_config *)&fStack_18f8.config.encryption_key);
  pfStack_1bc0 = (fdb_kvs_handle *)0x10deed;
  fdb_kvs_open_default(pfStack_1ba8,&pfStack_1bb0,&fStack_1b58);
  pcVar22 = "%dkey";
  pcVar12 = (char *)&fStack_18f8;
  pcVar6 = auStack_1b40 + 0x48;
  pfVar20 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1bc0 = (fdb_kvs_handle *)0x10df15;
    sprintf(pcVar12,"%dkey",pfVar20);
    pfStack_1bc0 = (fdb_kvs_handle *)0x10df27;
    memset(pcVar6,0x61,0x1ff);
    pfVar10 = pfStack_1bb0;
    uStack_18f9 = 0;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10df3c;
    pfVar11 = (fdb_kvs_handle *)strlen(pcVar12);
    pfStack_1bc0 = (fdb_kvs_handle *)0x10df47;
    sVar5 = strlen(pcVar6);
    pfStack_1bc0 = (fdb_kvs_handle *)0x10df5b;
    fVar2 = fdb_set_kv(pfVar10,pcVar12,(size_t)pfVar11,pcVar6,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010e2c3:
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e2ca;
      fragmented_reuse_test();
      goto LAB_0010e2ca;
    }
    pfStack_1bc0 = (fdb_kvs_handle *)0x10df72;
    fVar2 = fdb_commit(pfStack_1ba8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e2c3;
      fragmented_reuse_test();
      goto LAB_0010e2c3;
    }
    uVar16 = (int)pfVar20 + 1;
    pfVar20 = (fdb_kvs_handle *)(ulong)uVar16;
  } while (uVar16 != 0xb);
  pcVar6 = (char *)&fStack_18f8;
  pfVar10 = (fdb_kvs_handle *)(auStack_1b40 + 0x48);
  pfVar11 = (fdb_kvs_handle *)auStack_1b40;
  pcVar22 = (char *)0x0;
  do {
    uVar16 = (uint)pcVar22;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10dfab;
    sprintf(pcVar6,"%dkey",pcVar22);
    pfVar20 = pfStack_1bb0;
    auStack_1b40._72_8_ = (filemgr *)0x6262626262626262;
    pdStack_1af0 = (docio_handle *)0x6262626262626262;
    pbStack_1ae8 = (btreeblk_handle *)0x6262626262626262;
    pbStack_1ae0 = (btree_blk_ops *)0x6262626262626262;
    pfStack_1ad8 = (filemgr_ops *)0x6262626262626262;
    fStack_1ad0.chunksize = 0x6262;
    fStack_1ad0._2_2_ = 0x6262;
    fStack_1ad0.blocksize = 0x62626262;
    fStack_1ad0.buffercache_size = 0x6262626262626262;
    fStack_1ad0.wal_threshold = 0x6262626262626262;
    fStack_1ad0.wal_flush_before_commit = true;
    fStack_1ad0.auto_commit = true;
    fStack_1ad0._26_2_ = 0x6262;
    fStack_1ad0.purging_interval = 0x62626262;
    fStack_1ad0.seqtree_opt = 'b';
    fStack_1ad0.durability_opt = 'b';
    fStack_1ad0._34_2_ = 0x6262;
    fStack_1ad0.flags = 0x62626262;
    fStack_1ad0.compaction_buf_maxsize = 0x62626262;
    fStack_1ad0.cleanup_cache_onclose = true;
    fStack_1ad0.compress_document_body = true;
    fStack_1ad0.compaction_mode = 'b';
    fStack_1ad0.compaction_threshold = 'b';
    fStack_1ad0.compaction_minimum_filesize = 0x6262626262626262;
    fStack_1ad0.compactor_sleep_duration = 0x6262626262626262;
    fStack_1ad0.multi_kv_instances = true;
    fStack_1ad0._65_6_ = 0x626262626262;
    fStack_1ad0._71_1_ = 0x62;
    fStack_1ad0.prefetch_duration._0_7_ = 0x62626262626262;
    fStack_1ad0._79_8_ = 0x6262626262626262;
    fStack_1ad0._87_1_ = 0;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e007;
    pcVar12 = (char *)strlen(pcVar6);
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e012;
    sVar5 = strlen((char *)pfVar10);
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e026;
    fVar2 = fdb_set_kv(pfVar20,pcVar6,(size_t)pcVar12,pfVar10,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2d1;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e03b;
    fVar2 = fdb_get_file_info(pfStack_1ba8,(fdb_file_info *)pfVar11);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ca;
    uVar21 = uVar16 + 1;
    pcVar22 = (char *)(ulong)uVar21;
  } while ((ulong)auStack_1b40._40_8_ < (fdb_file_handle *)0x1000000);
  uStack_1b9c = uVar16;
  if (2 < uVar16) {
    uVar16 = (uVar21 >> 2) + (uint)(uVar21 >> 2 == 0);
    pfVar11 = (fdb_kvs_handle *)(ulong)uVar16;
    pcVar12 = "%dkey";
    pcVar6 = (char *)&fStack_18f8;
    pfVar20 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e092;
      sprintf(pcVar6,"%dkey",pfVar20);
      pfVar10 = pfStack_1bb0;
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e09f;
      sVar5 = strlen(pcVar6);
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e0ad;
      fVar2 = fdb_del_kv(pfVar10,pcVar6,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2df;
      uVar17 = (int)pfVar20 + 1;
      pfVar20 = (fdb_kvs_handle *)(ulong)uVar17;
    } while (uVar16 != uVar17);
  }
  pcVar6 = (char *)&fStack_18f8;
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e0c6;
  sVar3 = sb_check_block_reusing(pfStack_1bb0);
  if (sVar3 == SBD_NONE) {
    pcVar6 = (char *)(pfStack_1bb0->file->pos).super___atomic_base<unsigned_long>._M_i;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e0ec;
    fVar2 = fdb_compact(pfStack_1ba8,"staleblktest_compact");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2f9;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e103;
    fVar2 = fdb_get_kvs_info(pfStack_1bb0,&fStack_1b98);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e300;
    if (fStack_1b98.doc_count == 0) {
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e11d;
      fragmented_reuse_test();
    }
    pcVar12 = (char *)(ulong)(uVar21 >> 2);
    if (pcVar6 <= (fdb_kvs_handle *)
                  (pfStack_1bb0->file->pos).super___atomic_base<unsigned_long>._M_i) {
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e143;
      fragmented_reuse_test();
    }
    uVar16 = uVar21 >> 1;
    pfVar20 = (fdb_kvs_handle *)(ulong)uVar16;
    if (uVar21 >> 2 < uVar16) {
      pcVar6 = "%dkey";
      pfVar10 = &fStack_18f8;
      do {
        pfStack_1bc0 = (fdb_kvs_handle *)0x10e16b;
        sprintf((char *)pfVar10,"%dkey",pcVar12);
        pfVar11 = pfStack_1bb0;
        pfStack_1bc0 = (fdb_kvs_handle *)0x10e178;
        sVar5 = strlen((char *)pfVar10);
        pfStack_1bc0 = (fdb_kvs_handle *)0x10e186;
        fVar2 = fdb_del_kv(pfVar11,pfVar10,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2e6;
        uVar17 = (int)pcVar12 + 1;
        pcVar12 = (char *)(ulong)uVar17;
      } while (uVar17 < uVar16);
    }
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e1a0;
    sVar3 = sb_check_block_reusing(pfStack_1bb0);
    if (sVar3 != SBD_NONE) goto LAB_0010e307;
    if (uVar16 <= uStack_1b9c) {
      pcVar12 = "%dkey";
      pcVar6 = (char *)&fStack_18f8;
      do {
        pfStack_1bc0 = (fdb_kvs_handle *)0x10e1cc;
        sprintf(pcVar6,"%dkey",pfVar20);
        pfVar10 = pfStack_1bb0;
        pfStack_1bc0 = (fdb_kvs_handle *)0x10e1d9;
        sVar5 = strlen(pcVar6);
        pfStack_1bc0 = (fdb_kvs_handle *)0x10e1e7;
        fVar2 = fdb_del_kv(pfVar10,pcVar6,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ed;
        uVar16 = (int)pfVar20 + 1;
        pfVar20 = (fdb_kvs_handle *)(ulong)uVar16;
      } while (uVar21 != uVar16);
    }
    pcVar22 = (char *)0xb;
    do {
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e209;
      fVar2 = fdb_commit(pfStack_1ba8,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2d8;
      uVar16 = (int)pcVar22 - 1;
      pcVar22 = (char *)(ulong)uVar16;
    } while (uVar16 != 0);
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e224;
    fVar2 = fdb_get_kvs_info(pfStack_1bb0,&fStack_1b98);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e30c;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e236;
    sVar3 = sb_check_block_reusing(pfStack_1bb0);
    if (sVar3 == SBD_NONE) goto LAB_0010e313;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e24d;
    fVar2 = fdb_commit(pfStack_1ba8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e318;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e25f;
    fVar2 = fdb_close(pfStack_1ba8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e31f;
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e26c;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e279;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (fragmented_reuse_test()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pfStack_1bc0 = (fdb_kvs_handle *)0x10e2aa;
      fprintf(_stderr,pcVar12,"fragmented reuse test");
      return;
    }
  }
  else {
LAB_0010e2f4:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e2f9;
    fragmented_reuse_test();
LAB_0010e2f9:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e300;
    fragmented_reuse_test();
LAB_0010e300:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e307;
    fragmented_reuse_test();
LAB_0010e307:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e30c;
    fragmented_reuse_test();
LAB_0010e30c:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e313;
    fragmented_reuse_test();
LAB_0010e313:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e318;
    fragmented_reuse_test();
LAB_0010e318:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e31f;
    fragmented_reuse_test();
LAB_0010e31f:
    pfStack_1bc0 = (fdb_kvs_handle *)0x10e326;
    fragmented_reuse_test();
  }
  pfStack_1bc0 = (fdb_kvs_handle *)enter_reuse_via_separate_kvs_test;
  fragmented_reuse_test();
  pcStackY_2088 = (code *)0x10e34a;
  pcStack_1be8 = pcVar22;
  pfStack_1be0 = pfVar10;
  pfStack_1bd8 = pfVar11;
  pfStack_1bd0 = (fdb_kvs_handle *)pcVar12;
  pfStack_1bc8 = (fdb_kvs_handle *)pcVar6;
  pfStack_1bc0 = pfVar20;
  gettimeofday(&tStack_2050,(__timezone_ptr_t)0x0);
  pcStackY_2088 = (code *)0x10e34f;
  memleak_start();
  pfStack_2060 = (fdb_doc *)0x0;
  pcStackY_2088 = (code *)0x10e368;
  fdb_get_default_kvs_config();
  pcStackY_2088 = (code *)0x10e378;
  fdb_get_default_config();
  fStack_1ce0.compaction_threshold = '\0';
  fStack_1ce0.block_reusing_threshold = 0x23;
  fStack_1ce0.num_keeping_headers = 10;
  pcStackY_2088 = (code *)0x10e39f;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStackY_2088 = (code *)0x10e3b6;
  fdb_open(&pfStack_2070,"./staleblktest1",&fStack_1ce0);
  pcStackY_2088 = (code *)0x10e3cd;
  fdb_kvs_open(pfStack_2070,&pfStack_2078,"db",&fStack_1e40);
  pcStackY_2088 = (code *)0x10e3e4;
  fdb_kvs_open(pfStack_2070,&pfStack_2058,"db2",&fStack_1e40);
  pcVar12 = acStack_1de0;
  doc = (fdb_doc **)0x6161616161616161;
  pcVar6 = acStack_2040;
  pcVar22 = (char *)0x0;
  do {
    pcStackY_2088 = (code *)0x10e410;
    sprintf(pcVar12,"%dkey",pcVar22);
    pfVar20 = pfStack_2078;
    builtin_strncpy(acStack_2040,"aaaaaaaaaaa",0xc);
    pcStackY_2088 = (code *)0x10e42f;
    sVar8 = strlen(pcVar12);
    pcStackY_2088 = (code *)0x10e43a;
    sVar5 = strlen(pcVar6);
    pcStackY_2088 = (code *)0x10e44e;
    fVar2 = fdb_set_kv(pfVar20,pcVar12,sVar8,pcVar6,sVar5);
    pfVar20 = pfStack_2058;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStackY_2088 = (code *)0x10e759;
      enter_reuse_via_separate_kvs_test();
LAB_0010e759:
      pcStackY_2088 = (code *)0x10e760;
      enter_reuse_via_separate_kvs_test();
LAB_0010e760:
      pcStackY_2088 = (code *)0x10e767;
      enter_reuse_via_separate_kvs_test();
      goto LAB_0010e767;
    }
    pcStackY_2088 = (code *)0x10e463;
    sVar8 = strlen(pcVar12);
    pcStackY_2088 = (code *)0x10e46e;
    sVar5 = strlen(pcVar6);
    pcStackY_2088 = (code *)0x10e482;
    fVar2 = fdb_set_kv(pfVar20,pcVar12,sVar8,pcVar6,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e759;
    pcStackY_2088 = (code *)0x10e499;
    fVar2 = fdb_commit(pfStack_2070,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e760;
    uVar16 = (int)pcVar22 + 1;
    pcVar22 = (char *)(ulong)uVar16;
  } while (uVar16 != 10);
  pcVar6 = (char *)0x0;
  pcVar22 = acStack_1de0;
  pcVar12 = acStack_2040;
  doc = (fdb_doc **)0x0;
  do {
    pfVar20 = pfStack_2078;
    builtin_strncpy(acStack_1de0,"0key",5);
    builtin_strncpy(acStack_2040,
                    "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                    ,0x80);
    pcStackY_2088 = (code *)0x10e521;
    sVar8 = strlen(pcVar22);
    pcStackY_2088 = (code *)0x10e52c;
    sVar5 = strlen(pcVar12);
    pcStackY_2088 = (code *)0x10e540;
    fVar2 = fdb_set_kv(pfVar20,pcVar22,sVar8,pcVar12,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e76e;
    pcStackY_2088 = (code *)0x10e55a;
    fVar2 = fdb_get_file_info(pfStack_2070,&fStack_1e28);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e767;
    uVar16 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar16;
  } while (fStack_1e28.file_size < 0x1000000);
  pcStackY_2088 = (code *)0x10e580;
  sVar3 = sb_check_block_reusing(pfStack_2078);
  if (sVar3 == SBD_RECLAIM) {
    pcStackY_2088 = (code *)0x10e598;
    fVar2 = fdb_commit(pfStack_2070,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e786;
    pcVar12 = acStack_1de0;
    pcVar6 = acStack_2040;
    pcVar22 = (char *)0x0;
    do {
      pcStackY_2088 = (code *)0x10e5c2;
      sprintf(pcVar12,"key%d",pcVar22);
      pfVar20 = pfStack_2078;
      builtin_strncpy(acStack_2040,
                      "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                      ,0x80);
      pcStackY_2088 = (code *)0x10e612;
      sVar8 = strlen(pcVar12);
      pcStackY_2088 = (code *)0x10e61d;
      sVar5 = strlen(pcVar6);
      pcStackY_2088 = (code *)0x10e631;
      fVar2 = fdb_set_kv(pfVar20,pcVar12,sVar8,pcVar6,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e775;
      uVar21 = (int)pcVar22 + 1;
      pcVar22 = (char *)(ulong)uVar21;
    } while (uVar16 != uVar21);
    pcStackY_2088 = (code *)0x10e652;
    fVar2 = fdb_commit(pfStack_2070,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e78d;
    pcStackY_2088 = (code *)0x10e67a;
    fdb_iterator_init(pfStack_2058,&pfStack_2068,(void *)0x0,0,(void *)0x0,0,0);
    pcVar22 = (char *)0xa;
    doc = &pfStack_2060;
    do {
      pcStackY_2088 = (code *)0x10e691;
      fVar2 = fdb_iterator_get(pfStack_2068,doc);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e77c;
      pcStackY_2088 = (code *)0x10e6a3;
      fdb_doc_free(pfStack_2060);
      pfStack_2060 = (fdb_doc *)0x0;
      pcStackY_2088 = (code *)0x10e6b6;
      fVar2 = fdb_iterator_next(pfStack_2068);
      uVar16 = (int)pcVar22 - 1;
      pcVar22 = (char *)(ulong)uVar16;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar16 != 0) goto LAB_0010e794;
    pcStackY_2088 = (code *)0x10e6cf;
    fdb_iterator_close(pfStack_2068);
    pcStackY_2088 = (code *)0x10e6d9;
    fVar2 = fdb_kvs_close(pfStack_2078);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e799;
    pcStackY_2088 = (code *)0x10e6eb;
    fVar2 = fdb_kvs_close(pfStack_2058);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStackY_2088 = (code *)0x10e6fd;
      fVar2 = fdb_close(pfStack_2070);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStackY_2088 = (code *)0x10e70a;
        fdb_shutdown();
        pcStackY_2088 = (code *)0x10e70f;
        memleak_end();
        pcVar12 = "%s PASSED\n";
        if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
          pcVar12 = "%s FAILED\n";
        }
        pcStackY_2088 = (code *)0x10e740;
        fprintf(_stderr,pcVar12,"enter reuse via separate kvs test");
        return;
      }
      goto LAB_0010e7a7;
    }
  }
  else {
LAB_0010e781:
    pcStackY_2088 = (code *)0x10e786;
    enter_reuse_via_separate_kvs_test();
LAB_0010e786:
    pcStackY_2088 = (code *)0x10e78d;
    enter_reuse_via_separate_kvs_test();
LAB_0010e78d:
    pcStackY_2088 = (code *)0x10e794;
    enter_reuse_via_separate_kvs_test();
LAB_0010e794:
    pcStackY_2088 = (code *)0x10e799;
    enter_reuse_via_separate_kvs_test();
LAB_0010e799:
    pcStackY_2088 = (code *)0x10e7a0;
    enter_reuse_via_separate_kvs_test();
  }
  pcStackY_2088 = (code *)0x10e7a7;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7a7:
  pcStackY_2088 = child_function;
  enter_reuse_via_separate_kvs_test();
  ppfStackY_20b0 = doc;
  sStackY_20a0 = sVar8;
  pcStackY_2098 = pcVar12;
  pcStackY_2090 = pcVar6;
  pcStackY_2088 = (code *)pcVar22;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStackY_23b0.block_reusing_threshold = 0x41;
  fStackY_23b0.num_keeping_headers = 5;
  fdb_open(&pfStackY_24d8,"./staleblktest1",&fStackY_23b0);
  fdb_kvs_open(pfStackY_24d8,&pfStackY_24e0,"db",&fStackY_24d0);
  iVar4 = 0;
  uVar18 = 0;
  do {
    sprintf(acStackY_24b8,"key%d",uVar18);
    sprintf(acStackY_22b8,"seqno%d",uVar18);
    pfVar20 = pfStackY_24e0;
    sVar5 = strlen(acStackY_24b8);
    sVar8 = strlen(acStackY_22b8);
    fdb_set_kv(pfVar20,acStackY_24b8,sVar5,acStackY_22b8,sVar8);
    if ((int)(uVar18 / 100) * 100 + iVar4 == 0) {
      fdb_commit(pfStackY_24d8,(int)(uVar18 / 500) * 500 + iVar4 == 0);
    }
    uVar18 = (ulong)((int)uVar18 + 1);
    iVar4 = iVar4 + -1;
  } while( true );
LAB_0010c9d3:
  pcStack_388 = (code *)0x10c9da;
  snapshot_inmem_before_block_reuse_test();
LAB_0010c9da:
  pcStack_388 = (code *)0x10c9e1;
  snapshot_inmem_before_block_reuse_test();
LAB_0010c9e1:
  pcStack_388 = (code *)0x10c9e8;
  snapshot_inmem_before_block_reuse_test();
LAB_0010c9e8:
  pcStack_388 = (code *)0x10c9ef;
  snapshot_inmem_before_block_reuse_test();
  fVar2 = extraout_EAX;
  goto LAB_0010c9ef;
code_r0x0010cc6c:
  unaff_RBP = unaff_RBP + 0x400;
  if (unaff_RBP == 0xfff) goto code_r0x0010cc7c;
  goto LAB_0010cc13;
code_r0x0010cc7c:
  pcStack_670 = (code *)0x10cc8b;
  fVar2 = fdb_get_file_info(pfStack_660,&fStack_5f0);
  aVar23 = aStack_650;
  sVar19 = sStack_658;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d06a;
  handle.seqtree = (btree *)&(aStack_650.seqtree)->vsize;
  sVar7 = (size_t)((int)sStack_658 + 8);
  if (0xffffff < fStack_5f0.file_size) goto code_r0x0010ccb6;
  goto LAB_0010cc04;
LAB_0010d06a:
  pcStack_670 = (code *)0x10d071;
  variable_value_size_test();
LAB_0010d071:
  pcStack_670 = (code *)0x10d078;
  variable_value_size_test();
  aVar24 = handle;
LAB_0010d078:
  handle = aVar24;
  pcStack_670 = (code *)0x10d07f;
  variable_value_size_test();
LAB_0010d07f:
  pcStack_670 = (code *)0x10d086;
  variable_value_size_test();
  sVar19 = unaff_RBP;
  aVar23 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar22;
  goto LAB_0010d086;
code_r0x0010ccb6:
  pcStack_670 = (code *)0x10ccbf;
  sVar3 = sb_check_block_reusing((fdb_kvs_handle *)aStack_668.seqtree);
  if (sVar3 != SBD_RECLAIM) goto LAB_0010d08d;
  pcStack_670 = (code *)0x10ccd4;
  fVar2 = fdb_commit(pfStack_660,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d092;
  pcStack_670 = (code *)0x10ccf1;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_668.seqtree,
                            (fdb_kvs_handle **)&aStack_638.seqtree,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d099;
  if ((fdb_kvs_handle *)aVar23.seqtree != (fdb_kvs_handle *)0x0) {
    aStack_628.seqtree = aVar23.seqtree;
    pcVar12 = (char *)0x0;
    aStack_620 = handle;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = aVar23;
      uVar16 = (int)sVar19 + 1;
      pcStack_670 = (code *)0x10cd43;
      sprintf((char *)&fStack_5a8,"%d_key",(ulong)uVar16);
      sStack_658 = sVar19;
      aStack_650 = aVar23;
      if ((int)uVar16 < 2) {
        uVar18 = 0;
      }
      else {
        uVar18 = sVar19 & 0xffffffff;
        pcStack_670 = (code *)0x10cd65;
        memset(pcVar6,99,uVar18);
      }
      pcVar22 = (char *)aStack_668;
      pcVar6[uVar18] = '\0';
      pfVar14 = &fStack_5a8;
      pcStack_670 = (code *)0x10cd81;
      sVar5 = strlen((char *)pfVar14);
      unaff_RBP = sVar5 + 1;
      pcStack_670 = (code *)0x10cd8d;
      sVar5 = strlen(pcVar6);
      pcStack_670 = (code *)0x10cda2;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar22,pfVar14,unaff_RBP,pcVar6,sVar5 + 1);
      handle = aStack_620;
      aVar24 = SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d078;
      if ((fdb_kvs_handle *)
          (&((fdb_kvs_config *)&(aStack_620.seqtree)->ksize)->create_if_missing +
          ~(((ulong)aVar23.seqtree / 5 & 0xfffffffffffffffe) * 5)) == (fdb_kvs_handle *)pcVar12) {
        pcStack_670 = (code *)0x10cddc;
        fVar2 = fdb_commit(pfStack_660,'\x01');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d07f;
      }
      aVar23.seqtree = (btree *)((long)&aStack_650.seqtree[-1].aux + 7);
      pcVar12 = (char *)&((btree *)pcVar12)->vsize;
      sVar19 = (size_t)((int)sStack_658 - 8);
    } while (aStack_628.seqtree != (btree *)pcVar12);
  }
  pfVar14 = &fStack_5a8;
  pcStack_670 = (code *)0x10ce11;
  fVar2 = fdb_commit(pfStack_660,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0a0;
  aVar23.seqtree = (btree *)&fStack_5a8;
  pcStack_670 = (code *)0x10ce37;
  sprintf((char *)aVar23.seqtree,"%d_key",0x200);
  pcStack_670 = (code *)0x10ce49;
  memset(pcVar6,0x61,0x4fffff);
  pcVar12 = (char *)aStack_668;
  pcVar6[0x4fffff] = '\0';
  pcStack_670 = (code *)0x10ce5c;
  sVar5 = strlen((char *)aVar23.seqtree);
  pfVar14 = (fdb_config *)(sVar5 + 1);
  pcStack_670 = (code *)0x10ce68;
  sVar5 = strlen(pcVar6);
  pcStack_670 = (code *)0x10ce7d;
  fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar12,aVar23.seqtree,(size_t)pfVar14,pcVar6,sVar5 + 1);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0a7;
  pcStack_670 = (code *)0x10ce94;
  fVar2 = fdb_commit(pfStack_660,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0ae;
  pcStack_670 = (code *)0x10ceba;
  sprintf((char *)&fStack_5a8,"%d_key",0x200);
  pcStack_670 = (code *)0x10cecc;
  memset(pcVar6,0x61,0x1ff);
  pcVar12 = (char *)aStack_630;
  pcVar6[0x1ff] = '\0';
  pcStack_670 = (code *)0x10cee0;
  sVar5 = strlen((char *)&fStack_5a8);
  pcStack_670 = (code *)0x10cef9;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar12,(btree *)&fStack_5a8,sVar5 + 1,&aStack_640.seqtree,
                     (size_t *)&pkStack_648);
  aVar24 = aStack_640;
  aVar23.seqtree = (btree *)&fStack_5a8;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0b5;
  pcStack_670 = (code *)0x10cf16;
  iVar4 = bcmp(pcVar6,aStack_640.seqtree,(size_t)pkStack_648);
  if (iVar4 != 0) goto LAB_0010d0bc;
  pcStack_670 = (code *)0x10cf26;
  fVar2 = fdb_free_block(aVar24.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0c4;
  aVar24.seqtree = (btree *)&fStack_5a8;
  pcStack_670 = (code *)0x10cf4c;
  sprintf((char *)aVar24.seqtree,"%d_key",0x800);
  pcStack_670 = (code *)0x10cf5e;
  memset(pcVar6,0x62,0x7ff);
  pcVar12 = (char *)aStack_638;
  pcVar6[0x7ff] = '\0';
  pcStack_670 = (code *)0x10cf72;
  sVar5 = strlen((char *)aVar24.seqtree);
  pcStack_670 = (code *)0x10cf8b;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar12,aVar24.seqtree,sVar5 + 1,&aStack_640.seqtree,
                     (size_t *)&pkStack_648);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0cb;
  pcStack_670 = (code *)0x10cfa8;
  iVar4 = bcmp(pcVar6,aStack_640.seqtree,(size_t)pkStack_648);
  aVar24 = aStack_640;
  if (iVar4 != 0) goto LAB_0010d0d2;
  pcStack_670 = (code *)0x10cfb8;
  fVar2 = fdb_free_block(aStack_640.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0da;
  pcStack_670 = (code *)0x10cfc8;
  operator_delete__(pcVar6);
  pcStack_670 = (code *)0x10cfd1;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_668.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0e1;
  pcStack_670 = (code *)0x10cfe3;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_630.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0e8;
  pcStack_670 = (code *)0x10cff5;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_638.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0ef;
  pcStack_670 = (code *)0x10d007;
  fVar2 = fdb_close(pfStack_660);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_670 = (code *)0x10d014;
    fdb_shutdown();
    pcStack_670 = (code *)0x10d019;
    memleak_end();
    pcVar12 = "%s PASSED\n";
    if (variable_value_size_test()::__test_pass != '\0') {
      pcVar12 = "%s FAILED\n";
    }
    pcStack_670 = (code *)0x10d04a;
    fprintf(_stderr,pcVar12,"variable value size test");
    return;
  }
  goto LAB_0010d0f6;
LAB_0010d44c:
  pcStack_d48 = (code *)0x10d453;
  rollback_with_num_keeping_headers();
LAB_0010d453:
  pcStack_d48 = (code *)0x10d45a;
  rollback_with_num_keeping_headers();
LAB_0010d45a:
  pcStack_d48 = (code *)0x10d461;
  rollback_with_num_keeping_headers();
  goto LAB_0010d461;
LAB_0010d9ef:
  pcStack_1230 = (code *)0x10d9f6;
  crash_and_recover_with_num_keeping_test();
LAB_0010d9f6:
  pcStack_1230 = (code *)0x10d9fd;
  crash_and_recover_with_num_keeping_test();
LAB_0010d9fd:
  pcStack_1230 = (code *)0x10da04;
  crash_and_recover_with_num_keeping_test();
LAB_0010da04:
  pcStack_1230 = (code *)0x10da0b;
  crash_and_recover_with_num_keeping_test();
LAB_0010da0b:
  pcStack_1230 = (code *)0x10da12;
  crash_and_recover_with_num_keeping_test();
LAB_0010da12:
  pcStack_1230 = (code *)0x10da19;
  crash_and_recover_with_num_keeping_test();
LAB_0010da19:
  pcStack_1230 = (code *)0x10da20;
  crash_and_recover_with_num_keeping_test();
  goto LAB_0010da20;
LAB_0010de20:
  pfStack_16d8 = (fdb_kvs_handle *)0x10de27;
  reuse_on_delete_test();
LAB_0010de27:
  pfVar9 = pfVar10;
  pfStack_16d8 = (fdb_kvs_handle *)0x10de2e;
  reuse_on_delete_test();
LAB_0010de2e:
  pfStack_16d8 = (fdb_kvs_handle *)0x10de35;
  reuse_on_delete_test();
LAB_0010de35:
  pfStack_16d8 = (fdb_kvs_handle *)0x10de3c;
  reuse_on_delete_test();
  pfVar10 = pfVar9;
  goto LAB_0010de3c;
LAB_0010e2ca:
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e2d1;
  fragmented_reuse_test();
LAB_0010e2d1:
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e2d8;
  fragmented_reuse_test();
LAB_0010e2d8:
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e2df;
  fragmented_reuse_test();
LAB_0010e2df:
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e2e6;
  fragmented_reuse_test();
LAB_0010e2e6:
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e2ed;
  fragmented_reuse_test();
LAB_0010e2ed:
  pfStack_1bc0 = (fdb_kvs_handle *)0x10e2f4;
  fragmented_reuse_test();
  goto LAB_0010e2f4;
LAB_0010e767:
  pcStackY_2088 = (code *)0x10e76e;
  enter_reuse_via_separate_kvs_test();
LAB_0010e76e:
  pcStackY_2088 = (code *)0x10e775;
  enter_reuse_via_separate_kvs_test();
LAB_0010e775:
  pcStackY_2088 = (code *)0x10e77c;
  enter_reuse_via_separate_kvs_test();
LAB_0010e77c:
  pcStackY_2088 = (code *)0x10e781;
  enter_reuse_via_separate_kvs_test();
  goto LAB_0010e781;
}

Assistant:

void snapshot_after_block_reuse_test() {
    memleak_start();
    TEST_INIT();

    int i, r;
    int low_seq = 0;
    int nheaders=5;
    char keybuf[16];

    fdb_file_handle* dbfile;
    fdb_kvs_handle* db;
    fdb_kvs_handle* snap_db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_info file_info;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;
    fconfig.num_keeping_headers = nheaders;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "num_keep", &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "val";

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    // create lowest commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    low_seq = i;

    // create nheaders
    for (i = 0; i < nheaders + 5; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // make sure all blocks up to kept headers are reused
    i = low_seq;
    while (--i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // open snapshot on lowest seqno available
    low_seq += 6;
    status = fdb_snapshot_open(db, &snap_db, low_seq);
    TEST_STATUS(status);
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);

    // open snapshot using seqno already reclaimed
    status = fdb_snapshot_open(db, &snap_db, low_seq-1);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("snapshot after block reuse test");
}